

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void regenerateSpherePositions(void)

{
  ulong uVar1;
  bool bVar2;
  pointer ptVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  std::vector<glm::detail::tvec3<float>,_std::allocator<glm::detail::tvec3<float>_>_>::resize
            (&sphere_positions,(ulong)(uint)(((int)theta_n + 1) * ((int)phi_n + 1)));
  uVar5 = CONCAT44(phi_n._4_4_,(int)phi_n);
  lVar4 = 0;
  uVar9 = 0;
  do {
    lVar6 = lVar4;
    fVar10 = ((float)(int)uVar9 * 3.1415927) / (float)uVar5;
    fVar11 = cosf(fVar10);
    fVar10 = sinf(fVar10);
    uVar5 = CONCAT44(theta_n._4_4_,(int)theta_n);
    lVar7 = lVar6 * 0xc;
    uVar8 = 0;
    do {
      fVar12 = ((float)(int)uVar8 * 6.2831855) / (float)uVar5;
      fVar13 = sinf(fVar12);
      fVar12 = cosf(fVar12);
      ptVar3 = sphere_positions.
               super__Vector_base<glm::detail::tvec3<float>,_std::allocator<glm::detail::tvec3<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(float *)((long)&(sphere_positions.
                         super__Vector_base<glm::detail::tvec3<float>,_std::allocator<glm::detail::tvec3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar7) =
           fVar13 * fVar10;
      *(float *)((long)&ptVar3->field_0 + lVar7 + 4) = -fVar11;
      *(float *)((long)&ptVar3->field_0 + lVar7 + 8) = fVar12 * fVar10;
      uVar1 = uVar8 + 1;
      uVar5 = CONCAT44(theta_n._4_4_,(int)theta_n);
      lVar7 = lVar7 + 0xc;
      bVar2 = uVar8 < uVar5;
      uVar8 = uVar1;
    } while (bVar2);
    uVar5 = CONCAT44(phi_n._4_4_,(int)phi_n);
    bVar2 = uVar9 < uVar5;
    lVar4 = lVar6 + uVar1;
    uVar9 = uVar9 + 1;
  } while (bVar2);
  vertex_count = lVar6 + uVar1;
  (*__glewBindBuffer)(0x8892,sphere_buffer);
  (*__glewBufferData)(0x8892,lVar7,
                      sphere_positions.
                      super__Vector_base<glm::detail::tvec3<float>,_std::allocator<glm::detail::tvec3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,0x88e4);
  return;
}

Assistant:

void regenerateSpherePositions() {
    Perf stat("Regenerate Sphere positions");
    sphere_positions.resize(uint((phi_n + 1) * (theta_n + 1)));
    size_t n = 0;
    for (int phi_i = 0; phi_i <= phi_n; phi_i++) {
        float phi = float(M_PI) * phi_i / phi_n;
        float y = -cos(phi);
        float r = sin(phi); // cylindrical radius

        for (int theta_i = 0; theta_i <= theta_n; theta_i++) {
            float theta = float(M_PI) * 2 * theta_i / theta_n;
            float x = r * sin(theta);
            float z = r * cos(theta);
            sphere_positions[n++] = vec3(x, y, z);
        }
    }

    vertex_count = n;

    glBindBuffer(GL_ARRAY_BUFFER, sphere_buffer);
    glBufferData(GL_ARRAY_BUFFER, n * sizeof(vec3), sphere_positions.data(), GL_STATIC_DRAW);
}